

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpack-validate.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  ostream *poVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  long lVar12;
  char *pcVar13;
  size_t i;
  size_type sVar14;
  string s;
  string infile;
  Validator validator;
  ifstream ifs;
  size_type local_8238;
  int aiStack_8220 [122];
  char buffer [32768];
  
  bVar5 = true;
  bVar4 = false;
  pcVar13 = (char *)0x0;
  for (lVar12 = 1; lVar12 < argc; lVar12 = lVar12 + 1) {
    pcVar11 = argv[lVar12];
    if (bVar5) {
      bVar3 = isOption(pcVar11,"--help");
      if (bVar3) {
        usage(argv);
        return 0;
      }
      bVar3 = isOption(pcVar11,"--hex");
      if (bVar3) {
        bVar4 = true;
        bVar5 = true;
      }
      else {
        bVar3 = isOption(pcVar11,"--");
        if (!bVar3) goto LAB_00102474;
        bVar5 = false;
      }
    }
    else {
LAB_00102474:
      bVar3 = pcVar13 != (char *)0x0;
      pcVar13 = pcVar11;
      if (bVar3) {
        usage(argv);
        return 1;
      }
    }
  }
  pcVar11 = "-";
  if (pcVar13 != (char *)0x0) {
    pcVar11 = pcVar13;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&infile,pcVar11,(allocator<char> *)buffer);
  bVar5 = std::operator==(&infile,"-");
  if (bVar5) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&infile,"/proc/self/fd/0");
  }
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&ifs,(string *)&infile,_S_in);
  cVar6 = std::__basic_file<char>::is_open();
  if (cVar6 == '\0') {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Cannot read infile \'");
    poVar7 = std::operator<<(poVar7,(string *)&infile);
    poVar7 = std::operator<<(poVar7,"\'");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar9 = 1;
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
              (&s,0x8000);
    while (*(int *)((long)aiStack_8220 + *(long *)(_ifs + -0x18)) == 0) {
      std::istream::read((char *)&ifs,(long)buffer);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&s,buffer,local_8238);
    }
    std::ifstream::close();
    if (bVar4) {
      buffer._0_8_ = buffer + 0x10;
      buffer[8] = '\0';
      buffer[9] = '\0';
      buffer[10] = '\0';
      buffer[0xb] = '\0';
      buffer[0xc] = '\0';
      buffer[0xd] = '\0';
      buffer[0xe] = '\0';
      buffer[0xf] = '\0';
      buffer[0x10] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
                 s._M_string_length);
      sVar2 = s._M_string_length;
      iVar9 = -1;
      for (sVar14 = 0; sVar2 != sVar14; sVar14 = sVar14 + 1) {
        bVar1 = s._M_dataplus._M_p[sVar14];
        iVar8 = -1;
        if ((char)bVar1 < 0x30) goto LAB_00102651;
        iVar10 = -0x30;
        if (bVar1 < 0x3a) {
LAB_00102611:
          iVar8 = iVar10 + (char)bVar1;
          if (iVar9 != -1) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
                      (char)iVar8 + (char)(iVar9 << 4));
            iVar8 = -1;
          }
        }
        else if (bVar1 < 0x61) {
          iVar10 = -0x37;
          iVar8 = -1;
          if ((byte)(bVar1 + 0xbf) < 6) goto LAB_00102611;
        }
        else {
          iVar10 = -0x57;
          iVar8 = -1;
          if (bVar1 < 0x67) goto LAB_00102611;
        }
LAB_00102651:
        iVar9 = iVar8;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer);
      std::__cxx11::string::~string((string *)buffer);
    }
    buffer[0] = '\x02';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\x02';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    buffer[8] = '\0';
    buffer[9] = '\0';
    buffer[10] = '\0';
    buffer[0xb] = '\0';
    buffer[0xc] = '\0';
    buffer[0xd] = '\0';
    buffer[0xe] = '\0';
    buffer[0xf] = '\0';
    buffer[0x10] = '\0';
    buffer[0x11] = '\0';
    buffer[0x12] = '\0';
    buffer[0x13] = '\0';
    buffer[0x14] = '\0';
    buffer[0x15] = '\0';
    buffer[0x16] = '\0';
    buffer[0x17] = '\0';
    buffer[0x18] = '\0';
    buffer[0x19] = '\0';
    buffer[0x1a] = '\0';
    buffer[0x1b] = '\0';
    buffer[0x1c] = '\0';
    buffer[0x1d] = '\x01';
    buffer[0x20] = '\0';
    buffer[0x21] = '\x01';
    buffer[0x22] = '\0';
    buffer[0x23] = '\x01';
    buffer[0x24] = '\0';
    buffer[0x25] = '\0';
    buffer[0x26] = '\0';
    buffer[0x27] = '\0';
    buffer[0x28] = '\0';
    buffer[0x29] = '\0';
    buffer[0x2a] = '\0';
    buffer[0x2b] = '\0';
    buffer[0x2c] = -1;
    buffer[0x2d] = -1;
    buffer[0x2e] = -1;
    buffer[0x2f] = -1;
    buffer[0x1e] = '\x01';
    buffer[0x1f] = '\x01';
    arangodb::velocypack::Validator::Validator(&validator,(Options *)buffer);
    arangodb::velocypack::Validator::validate
              (&validator,(uint8_t *)s._M_dataplus._M_p,s._M_string_length,false);
    poVar7 = std::operator<<((ostream *)&std::cout,"The velocypack in infile \'");
    poVar7 = std::operator<<(poVar7,(string *)&infile);
    poVar7 = std::operator<<(poVar7,"\' is valid");
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar9 = 0;
  }
  std::ifstream::~ifstream(&ifs);
  std::__cxx11::string::~string((string *)&s);
  std::__cxx11::string::~string((string *)&infile);
  return iVar9;
}

Assistant:

int main(int argc, char* argv[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  char const* infileName = nullptr;
  bool allowFlags = true;
  bool hex = false;

  int i = 1;
  while (i < argc) {
    char const* p = argv[i];
    if (allowFlags && isOption(p, "--help")) {
      usage(argv);
      return EXIT_SUCCESS;
    } else if (allowFlags && isOption(p, "--hex")) {
      hex = true;
    } else if (allowFlags && isOption(p, "--")) {
      allowFlags = false;
    } else if (infileName == nullptr) {
      infileName = p;
    } else {
      usage(argv);
      return EXIT_FAILURE;
    }
    ++i;
  }

#ifdef __linux__
  if (infileName == nullptr) {
    infileName = "-";
  }
#endif

  if (infileName == nullptr) {
    usage(argv);
    return EXIT_FAILURE;
  }

  // treat "-" as stdin
  std::string infile = infileName;
#ifdef __linux__
  if (infile == "-") {
    infile = "/proc/self/fd/0";
  }
#endif

  std::string s;
  std::ifstream ifs(infile, std::ifstream::in);

  if (!ifs.is_open()) {
    std::cerr << "Cannot read infile '" << infile << "'" << std::endl;
    return EXIT_FAILURE;
  }

  {
    char buffer[32768];
    s.reserve(sizeof(buffer));

    while (ifs.good()) {
      ifs.read(&buffer[0], sizeof(buffer));
      s.append(buffer, checkOverflow(ifs.gcount()));
    }
  }
  ifs.close();

  if (hex) {
    s = convertFromHex(s);
  }

  Options options;
  options.checkAttributeUniqueness = true;
  options.validateUtf8Strings = true;

  try {
    Validator validator(&options);
    validator.validate(reinterpret_cast<uint8_t const*>(s.data()), s.size(),
                       false);
    std::cout << "The velocypack in infile '" << infile << "' is valid"
              << std::endl;
  } catch (Exception const& ex) {
    std::cerr << "An exception occurred while processing infile '" << infile
              << "': " << ex.what() << std::endl;
    return EXIT_FAILURE;
  } catch (...) {
    std::cerr << "An unknown exception occurred while processing infile '"
              << infile << "'" << std::endl;
    return EXIT_FAILURE;
  }

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}